

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

QVariant * __thiscall QObject::property(QObject *this,char *name)

{
  long lVar1;
  int index;
  QObjectPrivate *pQVar2;
  QMetaObject *this_00;
  size_t in_RCX;
  long in_RDX;
  QListSpecialMethodsBase<QByteArray> *in_RSI;
  QMetaProperty *in_RDI;
  long in_FS_OFFSET;
  int i;
  int id;
  QMetaObject *meta;
  QObjectPrivate *d;
  QMetaProperty p;
  QMetaProperty *t;
  QListSpecialMethodsBase<QByteArray> *name_00;
  QMetaProperty *this_01;
  QList<QVariant> *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  t = in_RDI;
  name_00 = in_RSI;
  this_01 = in_RDI;
  pQVar2 = d_func((QObject *)0x3f7f41);
  this_00 = (QMetaObject *)(*(code *)**(undefined8 **)in_RSI)();
  if ((in_RDX == 0) || (this_00 == (QMetaObject *)0x0)) {
    ::QVariant::QVariant((QVariant *)0x3f7f6f);
  }
  else {
    index = QMetaObject::indexOfProperty((QMetaObject *)this_01,(char *)name_00);
    if (index < 0) {
      if (pQVar2->extraData == (ExtraData *)0x0) {
        ::QVariant::QVariant((QVariant *)0x3f7fa4);
      }
      else {
        QListSpecialMethodsBase<QByteArray>::indexOf<char_const*>
                  (in_RSI,(char **)t,(qsizetype)in_RDI);
        QList<QVariant>::value(in_stack_ffffffffffffffd0,(qsizetype)this_01);
      }
    }
    else {
      QMetaObject::property(this_00,index);
      QMetaProperty::read(in_RDI,(int)&stack0xffffffffffffffd0,in_RSI,in_RCX);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QVariant *)t;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QObject::property(const char *name) const
{
    Q_D(const QObject);
    const QMetaObject *meta = metaObject();
    if (!name || !meta)
        return QVariant();

    int id = meta->indexOfProperty(name);
    if (id < 0) {
        if (!d->extraData)
            return QVariant();
        const int i = d->extraData->propertyNames.indexOf(name);
        return d->extraData->propertyValues.value(i);
    }
    QMetaProperty p = meta->property(id);
#ifndef QT_NO_DEBUG
    if (!p.isReadable())
        qWarning("%s::property: Property \"%s\" invalid or does not exist",
                 metaObject()->className(), name);
#endif
    return p.read(this);
}